

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.h
# Opt level: O2

uchar * append_uint32(uchar *cp,uint32_t i)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  
  if (i == 0) {
    *cp = '0';
LAB_0011a3a0:
    return cp + 1;
  }
  if (i < 100) {
    if (i < 10) {
      *cp = (byte)i | 0x30;
      goto LAB_0011a3a0;
    }
    bVar1 = (byte)(((ushort)i & 0xff) / 10);
    *cp = bVar1 | 0x30;
    cVar2 = bVar1 * -10 + (byte)i;
    goto LAB_0011a56b;
  }
  if (i < 10000) {
    if (999 < i) {
      uVar4 = (i & 0xffff) / 1000;
      *cp = (char)uVar4 + '0';
      uVar4 = uVar4 * -1000 + i;
      goto LAB_0011a54c;
    }
    uVar4 = (i & 0xffff) / 100;
    *cp = (byte)uVar4 | 0x30;
    cp = cp + 1;
    uVar3 = uVar4 * -100 + i;
  }
  else {
    if (i < 1000000) {
      if (99999 < i) {
        *cp = (byte)((ulong)i / 100000) | 0x30;
        uVar4 = (int)((ulong)i / 100000) * -100000 + i;
        goto LAB_0011a529;
      }
      *cp = (byte)((ulong)i / 10000) | 0x30;
      cp = cp + 1;
      uVar3 = (int)((ulong)i / 10000) * -10000 + i;
    }
    else {
      if (i < 100000000) {
        if (9999999 < i) {
          *cp = (byte)((ulong)i / 10000000) | 0x30;
          uVar4 = (int)((ulong)i / 10000000) * -10000000 + i;
          puVar5 = cp;
          goto LAB_0011a506;
        }
        *cp = (char)((ulong)i / 1000000) + '0';
        cp = cp + 1;
        uVar3 = (int)((ulong)i / 1000000) * -1000000 + i;
      }
      else {
        if (i < 1000000000) {
          puVar5 = cp + 1;
          bVar1 = (byte)((ulong)i / 100000000);
          uVar3 = (int)((ulong)i / 100000000) * -100000000 + i;
        }
        else {
          bVar1 = (byte)((ulong)i / 1000000000);
          uVar4 = (int)((ulong)i / 1000000000) * -1000000000 + i;
          uVar3 = uVar4 % 100000000;
          puVar5 = cp + 2;
          cp[1] = (char)((ulong)uVar4 / 100000000) + '0';
        }
        *cp = bVar1 | 0x30;
        uVar4 = uVar3 % 10000000;
        *puVar5 = (char)((ulong)uVar3 / 10000000) + '0';
LAB_0011a506:
        uVar3 = uVar4 % 1000000;
        puVar5[1] = (char)((ulong)uVar4 / 1000000) + '0';
        cp = puVar5 + 2;
      }
      uVar4 = uVar3 % 100000;
      *cp = (char)((ulong)uVar3 / 100000) + '0';
LAB_0011a529:
      uVar3 = uVar4 % 10000;
      cp[1] = (char)((ulong)uVar4 / 10000) + '0';
      cp = cp + 2;
    }
    uVar4 = uVar3 % 1000;
    *cp = (char)((ulong)uVar3 / 1000) + '0';
LAB_0011a54c:
    uVar3 = uVar4 % 100;
    cp[1] = (char)((ulong)uVar4 / 100) + '0';
    cp = cp + 2;
  }
  cVar2 = (char)((ulong)uVar3 % 10);
  *cp = (char)((ulong)uVar3 / 10) + '0';
LAB_0011a56b:
  cp[1] = cVar2 + '0';
  return cp + 2;
}

Assistant:

static inline unsigned char *append_uint32(unsigned char *cp, uint32_t i) {
    uint32_t j;

    if (i == 0) {
	*cp++ = '0';
	return cp;
    }

    if (i < 100)        goto b1;
    if (i < 10000)      goto b3;
    if (i < 1000000)    goto b5;
    if (i < 100000000)  goto b7;

    if ((j = i / 1000000000)) {*cp++ = j + '0'; i -= j*1000000000; goto x8;}
    if ((j = i / 100000000))  {*cp++ = j + '0'; i -= j*100000000;  goto x7;}
 b7:if ((j = i / 10000000))   {*cp++ = j + '0'; i -= j*10000000;   goto x6;}
    if ((j = i / 1000000))    {*cp++ = j + '0', i -= j*1000000;    goto x5;}
 b5:if ((j = i / 100000))     {*cp++ = j + '0', i -= j*100000;     goto x4;}
    if ((j = i / 10000))      {*cp++ = j + '0', i -= j*10000;      goto x3;}
 b3:if ((j = i / 1000))       {*cp++ = j + '0', i -= j*1000;       goto x2;}
    if ((j = i / 100))        {*cp++ = j + '0', i -= j*100;        goto x1;}
 b1:if ((j = i / 10))         {*cp++ = j + '0', i -= j*10;         goto x0;}
    if (i)                     *cp++ = i + '0';
    return cp;

 x8: *cp++ = i / 100000000 + '0', i %= 100000000;
 x7: *cp++ = i / 10000000  + '0', i %= 10000000;
 x6: *cp++ = i / 1000000   + '0', i %= 1000000;
 x5: *cp++ = i / 100000    + '0', i %= 100000;
 x4: *cp++ = i / 10000     + '0', i %= 10000;
 x3: *cp++ = i / 1000      + '0', i %= 1000;
 x2: *cp++ = i / 100       + '0', i %= 100;
 x1: *cp++ = i / 10        + '0', i %= 10;
 x0: *cp++ = i             + '0';

    return cp;
}